

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void Diligent::DefineInterfaceVar
               (int location,char *interpolation,char *inout,String *ParamType,String *ParamName,
               stringstream *OutSS)

{
  ostream *poVar1;
  
  if (-1 < location) {
    poVar1 = std::operator<<((ostream *)(OutSS + 0x10),"layout(location = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,location);
    std::operator<<(poVar1,") ");
  }
  if ((interpolation != (char *)0x0) && (*interpolation != '\0')) {
    poVar1 = std::operator<<((ostream *)(OutSS + 0x10),interpolation);
    std::operator<<(poVar1,' ');
  }
  poVar1 = std::operator<<((ostream *)(OutSS + 0x10),inout);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,(string *)ParamType);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,(string *)ParamName);
  std::operator<<(poVar1,";\n");
  return;
}

Assistant:

void DefineInterfaceVar(int location, const char* interpolation, const char* inout, const String& ParamType, const String& ParamName, std::stringstream& OutSS)
{
    if (location >= 0)
    {
        OutSS << "layout(location = " << location << ") ";
    }
    if (interpolation != nullptr && interpolation[0] != '\0')
    {
        OutSS << interpolation << ' ';
    }
    OutSS << inout << ' ' << ParamType << ' ' << ParamName << ";\n";
}